

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_check.cpp
# Opt level: O3

bool CheckTransaction(CTransaction *tx,TxValidationState *state)

{
  uint uVar1;
  pointer pCVar2;
  ulong uVar3;
  pointer pCVar4;
  bool bVar5;
  pointer pCVar6;
  uchar *puVar7;
  uint uVar8;
  ulong uVar9;
  pointer pCVar10;
  uint32_t *puVar11;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<COutPoint>,_bool> pVar12;
  set<COutPoint,_std::less<COutPoint>,_std::allocator<COutPoint>_> vInOutPoints;
  string local_a8;
  undefined1 local_88 [8];
  undefined1 local_80 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  _Base_ptr local_68;
  size_t local_60;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    local_88 = (undefined1  [8])(local_80 + 8);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"bad-txns-vin-empty","");
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
    bVar5 = ValidationState<TxValidationResult>::Invalid
                      (&state->super_ValidationState<TxValidationResult>,TX_CONSENSUS,
                       (string *)local_88,&local_58);
  }
  else if ((tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_start ==
           (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_finish) {
    local_88 = (undefined1  [8])(local_80 + 8);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"bad-txns-vout-empty","");
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
    bVar5 = ValidationState<TxValidationResult>::Invalid
                      (&state->super_ValidationState<TxValidationResult>,TX_CONSENSUS,
                       (string *)local_88,&local_58);
  }
  else {
    local_80 = (undefined1  [8])&local_58;
    local_58._M_dataplus._M_p = (pointer)0x0;
    local_88 = (undefined1  [8])&TX_NO_WITNESS;
    SerializeTransaction<ParamsStream<SizeComputer&,TransactionSerParams>,CTransaction>
              (tx,(ParamsStream<SizeComputer_&,_TransactionSerParams> *)local_88,&TX_NO_WITNESS);
    if ((ulong)((long)local_58._M_dataplus._M_p << 2) < 0x3d0901) {
      pCVar6 = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start;
      pCVar2 = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pCVar6 != pCVar2) {
        uVar9 = 0;
        do {
          uVar3 = pCVar6->nValue;
          if ((long)uVar3 < 0) {
            local_88 = (undefined1  [8])(local_80 + 8);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_88,"bad-txns-vout-negative","");
            local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
            bVar5 = ValidationState<TxValidationResult>::Invalid
                              (&state->super_ValidationState<TxValidationResult>,TX_CONSENSUS,
                               (string *)local_88,&local_58);
            goto LAB_008225e5;
          }
          if (2100000000000000 < uVar3) {
            local_88 = (undefined1  [8])(local_80 + 8);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_88,"bad-txns-vout-toolarge","");
            local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
            bVar5 = ValidationState<TxValidationResult>::Invalid
                              (&state->super_ValidationState<TxValidationResult>,TX_CONSENSUS,
                               (string *)local_88,&local_58);
            goto LAB_008225e5;
          }
          uVar9 = uVar9 + uVar3;
          if (2100000000000000 < uVar9) {
            local_88 = (undefined1  [8])(local_80 + 8);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_88,"bad-txns-txouttotal-toolarge","");
            local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
            bVar5 = ValidationState<TxValidationResult>::Invalid
                              (&state->super_ValidationState<TxValidationResult>,TX_CONSENSUS,
                               (string *)local_88,&local_58);
            goto LAB_008225e5;
          }
          pCVar6 = pCVar6 + 1;
        } while (pCVar6 != pCVar2);
      }
      local_78._8_8_ = local_80;
      local_80 = (undefined1  [8])((ulong)local_80 & 0xffffffff00000000);
      local_78._M_allocated_capacity = 0;
      local_60 = 0;
      pCVar10 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start;
      pCVar4 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish;
      local_68 = (_Base_ptr)local_78._8_8_;
      if (pCVar10 != pCVar4) {
        do {
          pVar12 = std::
                   _Rb_tree<COutPoint,COutPoint,std::_Identity<COutPoint>,std::less<COutPoint>,std::allocator<COutPoint>>
                   ::_M_insert_unique<COutPoint_const&>
                             ((_Rb_tree<COutPoint,COutPoint,std::_Identity<COutPoint>,std::less<COutPoint>,std::allocator<COutPoint>>
                               *)local_88,&pCVar10->prevout);
          if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_58,"bad-txns-inputs-duplicate","");
            local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"");
            bVar5 = ValidationState<TxValidationResult>::Invalid
                              (&state->super_ValidationState<TxValidationResult>,TX_CONSENSUS,
                               &local_58,&local_a8);
            goto LAB_00822935;
          }
          pCVar10 = pCVar10 + 1;
        } while (pCVar10 != pCVar4);
      }
      bVar5 = CTransaction::IsCoinBase(tx);
      pCVar10 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (bVar5) {
        uVar1 = (pCVar10->scriptSig).super_CScriptBase._size;
        uVar8 = uVar1 - 0x1d;
        if (uVar1 < 0x1d) {
          uVar8 = uVar1;
        }
        bVar5 = true;
        if (uVar8 - 0x65 < 0xffffff9d) {
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"bad-cb-length","");
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"");
          bVar5 = ValidationState<TxValidationResult>::Invalid
                            (&state->super_ValidationState<TxValidationResult>,TX_CONSENSUS,
                             &local_58,&local_a8);
LAB_00822935:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
        }
      }
      else {
        pCVar4 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        bVar5 = true;
        for (; pCVar10 != pCVar4; pCVar10 = pCVar10 + 1) {
          puVar11 = &(pCVar10->prevout).n;
          puVar7 = std::
                   __find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_negate<base_blob<256u>::IsNull()const::_lambda(unsigned_char)_1_>>
                             (pCVar10,puVar11);
          if (((uint32_t *)puVar7 == puVar11) && (*puVar11 == 0xffffffff)) {
            local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_58,"bad-txns-prevout-null","");
            local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"");
            bVar5 = ValidationState<TxValidationResult>::Invalid
                              (&state->super_ValidationState<TxValidationResult>,TX_CONSENSUS,
                               &local_58,&local_a8);
            goto LAB_00822935;
          }
        }
      }
      std::
      _Rb_tree<COutPoint,_COutPoint,_std::_Identity<COutPoint>,_std::less<COutPoint>,_std::allocator<COutPoint>_>
      ::~_Rb_tree((_Rb_tree<COutPoint,_COutPoint,_std::_Identity<COutPoint>,_std::less<COutPoint>,_std::allocator<COutPoint>_>
                   *)local_88);
      goto LAB_00822615;
    }
    local_88 = (undefined1  [8])(local_80 + 8);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"bad-txns-oversize","");
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
    bVar5 = ValidationState<TxValidationResult>::Invalid
                      (&state->super_ValidationState<TxValidationResult>,TX_CONSENSUS,
                       (string *)local_88,&local_58);
  }
LAB_008225e5:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_88 != (undefined1  [8])(local_80 + 8)) {
    operator_delete((void *)local_88,local_78._M_allocated_capacity + 1);
  }
LAB_00822615:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool CheckTransaction(const CTransaction& tx, TxValidationState& state)
{
    // Basic checks that don't depend on any context
    if (tx.vin.empty())
        return state.Invalid(TxValidationResult::TX_CONSENSUS, "bad-txns-vin-empty");
    if (tx.vout.empty())
        return state.Invalid(TxValidationResult::TX_CONSENSUS, "bad-txns-vout-empty");
    // Size limits (this doesn't take the witness into account, as that hasn't been checked for malleability)
    if (::GetSerializeSize(TX_NO_WITNESS(tx)) * WITNESS_SCALE_FACTOR > MAX_BLOCK_WEIGHT) {
        return state.Invalid(TxValidationResult::TX_CONSENSUS, "bad-txns-oversize");
    }

    // Check for negative or overflow output values (see CVE-2010-5139)
    CAmount nValueOut = 0;
    for (const auto& txout : tx.vout)
    {
        if (txout.nValue < 0)
            return state.Invalid(TxValidationResult::TX_CONSENSUS, "bad-txns-vout-negative");
        if (txout.nValue > MAX_MONEY)
            return state.Invalid(TxValidationResult::TX_CONSENSUS, "bad-txns-vout-toolarge");
        nValueOut += txout.nValue;
        if (!MoneyRange(nValueOut))
            return state.Invalid(TxValidationResult::TX_CONSENSUS, "bad-txns-txouttotal-toolarge");
    }

    // Check for duplicate inputs (see CVE-2018-17144)
    // While Consensus::CheckTxInputs does check if all inputs of a tx are available, and UpdateCoins marks all inputs
    // of a tx as spent, it does not check if the tx has duplicate inputs.
    // Failure to run this check will result in either a crash or an inflation bug, depending on the implementation of
    // the underlying coins database.
    std::set<COutPoint> vInOutPoints;
    for (const auto& txin : tx.vin) {
        if (!vInOutPoints.insert(txin.prevout).second)
            return state.Invalid(TxValidationResult::TX_CONSENSUS, "bad-txns-inputs-duplicate");
    }

    if (tx.IsCoinBase())
    {
        if (tx.vin[0].scriptSig.size() < 2 || tx.vin[0].scriptSig.size() > 100)
            return state.Invalid(TxValidationResult::TX_CONSENSUS, "bad-cb-length");
    }
    else
    {
        for (const auto& txin : tx.vin)
            if (txin.prevout.IsNull())
                return state.Invalid(TxValidationResult::TX_CONSENSUS, "bad-txns-prevout-null");
    }

    return true;
}